

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvstore.cpp
# Opt level: O1

bool __thiscall KVStore::del(KVStore *this,uint64_t key)

{
  string value;
  string local_60;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  (*(this->super_KVStoreAPI)._vptr_KVStoreAPI[1])(&local_40,this,key);
  if (local_38 != 0) {
    SkipList::remove(&this->memTable,(char *)key);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"~DELETED~","");
    SkipList::put(&this->memTable,key,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return local_38 != 0;
}

Assistant:

bool KVStore::del(uint64_t key) {
  auto value = get(key);
  if (value.empty()) return false;
  memTable.remove(key);
  memTable.put(key, "~DELETED~");
  return true;
}